

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O3

CAmount wallet::OutputGetCredit(CWallet *wallet,CTxOut *txout,isminefilter *filter)

{
  isminetype iVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  CAmount CVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  unique_lock<std::recursive_mutex> local_50;
  unique_lock<std::recursive_mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ulong)txout->nValue < 0x775f05a074001) {
    local_50._M_device = &(wallet->cs_wallet).super_recursive_mutex;
    local_50._8_8_ = local_50._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::recursive_mutex>::lock(&local_50);
    iVar1 = CWallet::IsMine(wallet,txout);
    if ((*filter & iVar1) == ISMINE_NO) {
      CVar4 = 0;
    }
    else {
      CVar4 = txout->nValue;
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_50);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return CVar4;
    }
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"OutputGetCredit","");
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_70,": value out of range");
    local_50._M_device = (mutex_type *)(pbVar2->_M_dataplus)._M_p;
    paVar3 = &pbVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_device == paVar3) {
      local_40._M_device = (mutex_type *)paVar3->_M_allocated_capacity;
      local_40._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
      local_50._M_device = (mutex_type *)&local_40;
    }
    else {
      local_40._M_device = (mutex_type *)paVar3->_M_allocated_capacity;
    }
    local_50._8_8_ = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    std::runtime_error::runtime_error(this,(string *)&local_50);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

CAmount OutputGetCredit(const CWallet& wallet, const CTxOut& txout, const isminefilter& filter)
{
    if (!MoneyRange(txout.nValue))
        throw std::runtime_error(std::string(__func__) + ": value out of range");
    LOCK(wallet.cs_wallet);
    return ((wallet.IsMine(txout) & filter) ? txout.nValue : 0);
}